

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
header_inclusion_csv_actions::module_start(header_inclusion_csv_actions *this,string *module)

{
  ostream *poVar1;
  string *module_local;
  header_inclusion_csv_actions *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)module);
  std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  this->first_header = true;
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << module << s_csv_separator;
        first_header = true;
    }